

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.hpp
# Opt level: O0

void __thiscall OpenMD::NPTf::~NPTf(NPTf *this)

{
  NPTf *in_RDI;
  
  ~NPTf(in_RDI);
  operator_delete(in_RDI,0x328);
  return;
}

Assistant:

NPTf(SimInfo* info) : NPT(info) {}